

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

void titlepic(void)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  FILE *__stream;
  ulong uVar4;
  uint cord;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint cord_00;
  long lVar8;
  
  __stream = fopen("data/title.bmp","rb");
  if (__stream == (FILE *)0x0) {
    printf("Titlepic fileopen Error");
    coniogetch();
    exit(1);
  }
  bVar1 = peekb(0x40,0x17);
  pokeb(0x40,0x17,bVar1 | 0x40);
  for (lVar8 = 0; lVar8 != -0x8000; lVar8 = lVar8 + -1) {
    iVar3 = getc(__stream);
    pic_temp_ram[(int)lVar8 + 0x7fff] = (ubyte)iVar3;
  }
  iVar3 = 0;
  for (iVar6 = 0; iVar6 != 0x10; iVar6 = iVar6 + 1) {
    setrgbpalette(iVar6,iVar3,iVar3,iVar3);
    setpalette((ubyte)iVar6,(ubyte)iVar6);
    iVar3 = iVar3 + 4;
  }
  setrgbpalette(0xf,0x3f,0,0);
  setpalette('\x0f','\x0f');
  uVar4 = 0x28a;
  cord = 0;
  for (uVar7 = 0; uVar7 != 200; uVar7 = uVar7 + 1) {
    sVar2 = cord - ((uVar7 & 3) == 0);
    cord = sVar2 + 2;
    cord_00 = sVar2 + 1;
    for (iVar3 = 0; iVar3 != -0x280; iVar3 = iVar3 + -4) {
      sVar2 = (short)iVar3;
      uVar5 = uVar4 & 0xffff;
      putpixel(sVar2 + 0x280U,cord,(uint)(pic_temp_ram[uVar5] >> 4));
      putpixel(sVar2 + 0x281U,cord,(uint)(pic_temp_ram[uVar5] >> 4));
      putpixel(sVar2 + 0x282U,cord,pic_temp_ram[uVar5] & 0xf);
      putpixel(sVar2 + 0x283U,cord,pic_temp_ram[uVar5] & 0xf);
      if ((uVar7 & 3) != 0) {
        putpixel(sVar2 + 0x280U,cord_00,(uint)(pic_temp_ram[uVar5] >> 4));
        putpixel(sVar2 + 0x281U,cord_00,(uint)(pic_temp_ram[uVar5] >> 4));
        putpixel(sVar2 + 0x282U,cord_00,pic_temp_ram[uVar5] & 0xf);
        putpixel(sVar2 + 0x283U,cord_00,pic_temp_ram[uVar5] & 0xf);
      }
      iVar6 = kbhit();
      if (iVar6 != 0) goto LAB_0010b7b5;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
  }
  setrgbpalette(0xf,0x3f,4,0);
  setpalette('\x0f','\x0f');
  delay(10);
LAB_0010b7b5:
  coniogetch();
  return;
}

Assistant:

void titlepic(void) {                     // the title picture display
    // display function
    int horz, vert;
    int vvert = 0;
    uint c, d = 0;
    uint red = 63, green = 0, blue = 0;

    FILE *title;

    if ((title = fopen("data/title.bmp", "rb")) == NULL) {
        printf("Titlepic fileopen Error");
        coniogetch();                            // open the picture file
        exit(1);
    };

    pokeb(0x0040, 0x0017, peekb(0x0040, 0x0017) | 0x40); // turn on capslock

    for (c = 0x8000; c; c--) {                          // load the picture
        pic_temp_ram[c - 1] = getc(title);
    }

    for (c = 0; c < 16; c++) {                            // initialise the palette
        setrgbpalette(c, c << 2, c << 2, c << 2);             // for greyscale
        setpalette(c, c);
    }

    setrgbpalette(15, 63, 0, 0);                       // set the red colour
    setpalette(15, 15);

    for (vert = 0, c = 650; vert < 200; vert++) {            // loop through each
        vvert++;                                     // pixel row

        if (vert & 0x3) vvert++;                       // scale output to fit
        // screen
        for (horz = 640; horz; horz -= 4, c++) {

            putpixel(horz + 0, vvert, pic_temp_ram[c] >> 4);
            putpixel(horz + 1, vvert, pic_temp_ram[c] >> 4);
            putpixel(horz + 2, vvert, pic_temp_ram[c] & 0xF);
            putpixel(horz + 3, vvert, pic_temp_ram[c] & 0xF);

            if (vert & 0x3) { // if y cord has been scaled, draw on original line
                vvert--;
                putpixel(horz + 0, vvert, pic_temp_ram[c] >> 4);
                putpixel(horz + 1, vvert, pic_temp_ram[c] >> 4);
                putpixel(horz + 2, vvert, pic_temp_ram[c] & 0xF);
                putpixel(horz + 3, vvert, pic_temp_ram[c] & 0xF);
                vvert++;
            }
            if (kbhit()) {
                coniogetch();
                return;
            }  // wait for keypress
        }
    }

    for (; ;)                             // cycle colours until
        for (c = 0; c <= 4; c++)
            for (d = 0; d < 15; d++) {
                switch (c) {
                    case 0:
                        green += 4;
                        break;
                    case 1:
                        red -= 4;
                        break;
                    case 2:
                        blue += 4;
                        break;
                    case 3:
                        green -= 4;
                        break;
                    case 4:
                        blue -= 4;
                        red += 4;
                        break;
                }
                setrgbpalette(15, red, green, blue);
                setpalette(15, 15);
                delay(10);                        // delay deliberately
                if (1 /*kbhit() */) {   // TODO no point waiting for press any key to continue
                    coniogetch();
                    return;
                }   // until keypressed
            }
}